

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::boostParticles
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list,double rap_shift)

{
  double dVar1;
  pointer ppvVar2;
  pointer paVar3;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  pointer ppvVar4;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  ppvVar2 = (input_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar4 = (input_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar4 != ppvVar2;
      ppvVar4 = ppvVar4 + 1) {
    paVar3 = ((*ppvVar4)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    for (paVar5 = ((*ppvVar4)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar5 != paVar3; paVar5 = paVar5 + 1) {
      dVar6 = paVar5->px;
      dVar12 = paVar5->py;
      paVar5->pT = SQRT(dVar6 * dVar6 + dVar12 * dVar12);
      dVar6 = atan2(dVar12,dVar6);
      paVar5->phi_p = dVar6;
      dVar6 = paVar5->E;
      dVar7 = cosh(rap_shift);
      dVar12 = paVar5->pz;
      dVar8 = sinh(rap_shift);
      dVar11 = paVar5->pz;
      dVar9 = cosh(rap_shift);
      dVar1 = paVar5->E;
      dVar10 = sinh(rap_shift);
      dVar11 = dVar9 * dVar11 + dVar10 * dVar1;
      dVar6 = dVar7 * dVar6 + dVar8 * dVar12;
      paVar5->pz = dVar11;
      paVar5->E = dVar6;
      dVar6 = log((dVar6 + dVar11) / (dVar6 - dVar11));
      paVar5->rap_y = dVar6 * 0.5;
      dVar6 = paVar5->pz;
      dVar12 = SQRT(paVar5->pT * paVar5->pT + dVar6 * dVar6);
      dVar6 = log((dVar6 + dVar12) / (dVar12 - dVar6));
      paVar5->rap_eta = dVar6 * 0.5;
    }
  }
  return;
}

Assistant:

void particleSamples::boostParticles(
    vector<vector<particle_info> *> *input_particle_list,
    const double rap_shift) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.pT = sqrt(part_i.px * part_i.px + part_i.py * part_i.py);
            part_i.phi_p = atan2(part_i.py, part_i.px);
            double E_shifted =
                (part_i.E * cosh(rap_shift) + part_i.pz * sinh(rap_shift));
            double pz_shifted =
                (part_i.pz * cosh(rap_shift) + part_i.E * sinh(rap_shift));
            part_i.E = E_shifted;
            part_i.pz = pz_shifted;

            part_i.rap_y =
                0.5 * log((part_i.E + part_i.pz) / (part_i.E - part_i.pz));
            double p_mag = sqrt(part_i.pT * part_i.pT + part_i.pz * part_i.pz);
            part_i.rap_eta =
                0.5 * log((p_mag + part_i.pz) / (p_mag - part_i.pz));
        }
    }
}